

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
::_do_write(WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,csubstr sp)

{
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined1 local_18 [8];
  long local_10;
  undefined1 *local_8;
  
  local_8 = local_18;
  if (in_RDX != 0 && in_RSI != 0) {
    local_10 = in_RDX;
    std::ostream::write((char *)*in_RDI,in_RSI);
    in_RDI[1] = local_10 + in_RDI[1];
  }
  return;
}

Assistant:

inline void _do_write(csubstr sp)
    {
        #if defined(__clang__)
        #   pragma clang diagnostic push
        #   pragma GCC diagnostic ignored "-Wsign-conversion"
        #elif defined(__GNUC__)
        #   pragma GCC diagnostic push
        #   pragma GCC diagnostic ignored "-Wsign-conversion"
        #endif
        if(sp.empty()) return;
        m_stream.write(sp.str, sp.len);
        m_pos += sp.len;
        #if defined(__clang__)
        #   pragma clang diagnostic pop
        #elif defined(__GNUC__)
        #   pragma GCC diagnostic pop
        #endif
    }